

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FreeFloatingState.cpp
# Opt level: O1

void __thiscall iDynTree::FreeFloatingVel::resize(FreeFloatingVel *this,Model *model)

{
  Twist *pTVar1;
  size_t nrOfDOFs;
  uint i;
  ulong uVar2;
  Twist *pTVar3;
  
  pTVar1 = &this->m_baseVel;
  uVar2 = 0;
  do {
    pTVar3 = (Twist *)(&this->field_0x20 + (ulong)((int)uVar2 - 3) * 8);
    if (uVar2 < 3) {
      pTVar3 = pTVar1;
    }
    *(undefined8 *)pTVar3 = 0;
    uVar2 = uVar2 + 1;
    pTVar1 = pTVar1 + 8;
  } while (uVar2 != 6);
  nrOfDOFs = Model::getNrOfDOFs(model);
  JointDOFsDoubleArray::resize(&this->m_jointVel,nrOfDOFs);
  iDynTree::VectorDynSize::zero();
  return;
}

Assistant:

void FreeFloatingVel::resize(const Model& model)
{
    this->m_baseVel.zero();
    this->m_jointVel.resize(model.getNrOfDOFs());
    this->m_jointVel.zero();
}